

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LArNESTFluctuationBenchmarks.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  allocator<NEST::LArInteraction> *this;
  allocator<double> *paVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  LArInteraction species;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  initializer_list<double> __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<NEST::LArInteraction> __l_03;
  pointer pdVar12;
  int iVar13;
  VDetector *detector_00;
  RandomGen *this_00;
  pointer pdVar14;
  reference pvVar15;
  size_type sVar16;
  reference pvVar17;
  iterator iVar18;
  iterator iVar19;
  reference pvVar20;
  ostream *poVar21;
  undefined4 uVar22;
  undefined4 uVar32;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar33 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_cd8;
  ulong local_c90;
  size_t ii_4;
  size_t ii_3;
  size_t ii_2;
  size_t ii_1;
  size_t ii;
  double Nion_std;
  double Nex_std;
  double Ne_std;
  double Nph_std;
  double Nq_std;
  double Nq_mean;
  double Nion_mean;
  double Nex_mean;
  double Ne_mean;
  double Nph_mean;
  ulong local_b58;
  size_t j;
  undefined1 local_b48 [8];
  vector<double,_std::allocator<double>_> Nion;
  undefined1 local_b28 [8];
  vector<double,_std::allocator<double>_> Nex;
  undefined1 local_b08 [8];
  vector<double,_std::allocator<double>_> Ne;
  undefined1 local_ae8 [8];
  vector<double,_std::allocator<double>_> Nph;
  size_t i_1;
  size_t v;
  double local_ab8 [9];
  iterator local_a70;
  undefined8 local_a68;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_a60;
  const_iterator local_a58;
  double *local_a50;
  double local_a48 [11];
  iterator local_9f0;
  undefined8 local_9e8;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_9e0;
  const_iterator local_9d8;
  double *local_9d0;
  double local_9c8 [11];
  iterator local_970;
  undefined8 local_968;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_960;
  const_iterator local_958;
  undefined1 local_950 [8];
  vector<double,_std::allocator<double>_> electric_field;
  size_t k;
  ofstream output_file;
  undefined1 local_730 [8];
  LArNESTResult result;
  LArNEST larnest;
  LArDetector *detector;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  string local_128 [32];
  string local_108 [32];
  iterator local_e8;
  size_type local_e0;
  undefined1 local_d8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  particle_type;
  undefined1 local_a0 [8];
  vector<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_> particle_types;
  double local_78;
  ulong local_70;
  size_t i;
  double step_size;
  double end_val;
  double start_val;
  vector<double,_std::allocator<double>_> energy_vals;
  size_type sStack_30;
  int num_energy_steps;
  uint64_t num_events;
  uint64_t seed;
  double density;
  char **argv_local;
  int argc_local;
  undefined1 auVar23 [16];
  
  seed = 0x3ff649ba5e353f7d;
  num_events = 0;
  sStack_30 = 100;
  if (1 < argc) {
    seed = (uint64_t)atof(argv[1]);
  }
  if (2 < argc) {
    iVar13 = atoi(argv[2]);
    num_events = (uint64_t)iVar13;
  }
  if (3 < argc) {
    iVar13 = atoi(argv[3]);
    sStack_30 = (size_type)iVar13;
  }
  energy_vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 50000;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&start_val);
  end_val = 0.1;
  step_size = 1000.0;
  i = (size_t)(999.9 / (double)energy_vals.super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
  for (local_70 = 0;
      local_70 <
      (ulong)(long)energy_vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_; local_70 = local_70 + 1) {
    auVar33._8_4_ = (int)(local_70 >> 0x20);
    auVar33._0_8_ = local_70;
    auVar33._12_4_ = 0x45300000;
    local_78 = (double)i *
               ((auVar33._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)local_70) - 4503599627370496.0)) + end_val;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              ((vector<double,_std::allocator<double>_> *)&start_val,&local_78);
  }
  particle_type.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  this = (allocator<NEST::LArInteraction> *)
         ((long)&particle_type.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 3);
  std::allocator<NEST::LArInteraction>::allocator(this);
  __l_03._M_len = 3;
  __l_03._M_array =
       (iterator)
       ((long)&particle_type.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
  std::vector<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_>::vector
            ((vector<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_> *)local_a0,__l_03,
             this);
  std::allocator<NEST::LArInteraction>::~allocator
            ((allocator<NEST::LArInteraction> *)
             ((long)&particle_type.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  detector._4_1_ = 1;
  local_150 = &local_148;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"NR",(allocator<char> *)((long)&detector + 7));
  local_150 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_128,"ER",(allocator<char> *)((long)&detector + 6));
  local_150 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_108,"Alpha",(allocator<char> *)((long)&detector + 5));
  detector._4_1_ = 0;
  local_e8 = &local_148;
  local_e0 = 3;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&detector + 3));
  __l_02._M_len = local_e0;
  __l_02._M_array = local_e8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_d8,__l_02,
           (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)((long)&detector + 3));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&detector + 3));
  local_cd8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e8;
  do {
    local_cd8 = local_cd8 + -1;
    std::__cxx11::string::~string((string *)local_cd8);
  } while (local_cd8 != &local_148);
  std::allocator<char>::~allocator((allocator<char> *)((long)&detector + 5));
  std::allocator<char>::~allocator((allocator<char> *)((long)&detector + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&detector + 7));
  detector_00 = (VDetector *)operator_new(0x128);
  LArDetector::LArDetector((LArDetector *)detector_00);
  NEST::LArNEST::LArNEST
            ((LArNEST *)
             &result.photon_times.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,detector_00);
  this_00 = RandomGen::rndm();
  RandomGen::SetSeed(this_00,num_events);
  NEST::LArNESTResult::LArNESTResult((LArNESTResult *)local_730);
  std::ofstream::ofstream(&k);
  std::ofstream::open(&k,"fluctuation_benchmarks.csv",0x10);
  std::operator<<((ostream *)&k,
                  "type,energy,efield,TotalYield,QuantaYield,LightYield,Nph,Ne,Nex,Nion,TotalYield_std,QuantaYield_std,LightYield_std,Nph_std,Ne_std,Nex_std,Nion_std\n"
                 );
  for (electric_field.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pdVar12 = electric_field.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,
      pdVar14 = (pointer)std::vector<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_>::
                         size((vector<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_> *
                              )local_a0), pdVar12 < pdVar14;
      electric_field.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)((long)electric_field.super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage + 1)) {
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_950);
    pvVar15 = std::vector<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_>::operator[]
                        ((vector<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_> *)
                         local_a0,(size_type)
                                  electric_field.super__Vector_base<double,_std::allocator<double>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (*pvVar15 == NR) {
      local_960._M_current =
           (double *)
           std::vector<double,_std::allocator<double>_>::end
                     ((vector<double,_std::allocator<double>_> *)local_950);
      __gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>::
      __normal_iterator<double*>
                ((__normal_iterator<double_const*,std::vector<double,std::allocator<double>>> *)
                 &local_958,&local_960);
      local_9c8[8] = 1750.0;
      local_9c8[9] = 2000.0;
      local_9c8[6] = 1000.0;
      local_9c8[7] = 1500.0;
      local_9c8[4] = 250.0;
      local_9c8[5] = 500.0;
      local_9c8[2] = 100.0;
      local_9c8[3] = 200.0;
      local_9c8[0] = 1.0;
      local_9c8[1] = 50.0;
      local_970 = local_9c8;
      local_968 = 10;
      __l_01._M_len = 10;
      __l_01._M_array = local_970;
      local_9d0 = (double *)
                  std::vector<double,_std::allocator<double>_>::insert
                            ((vector<double,_std::allocator<double>_> *)local_950,local_958,__l_01);
    }
    else {
      pvVar15 = std::vector<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_>::operator[]
                          ((vector<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_> *)
                           local_a0,(size_type)
                                    electric_field.
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage);
      if (*pvVar15 == ER) {
        local_9e0._M_current =
             (double *)
             std::vector<double,_std::allocator<double>_>::end
                       ((vector<double,_std::allocator<double>_> *)local_950);
        __gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>::
        __normal_iterator<double*>
                  ((__normal_iterator<double_const*,std::vector<double,std::allocator<double>>> *)
                   &local_9d8,&local_9e0);
        local_a48[8] = 9000.0;
        local_a48[9] = 9500.0;
        local_a48[6] = 2500.0;
        local_a48[7] = 6000.0;
        local_a48[4] = 1000.0;
        local_a48[5] = 1500.0;
        local_a48[2] = 200.0;
        local_a48[3] = 600.0;
        local_a48[0] = 1.0;
        local_a48[1] = 100.0;
        local_9f0 = local_a48;
        local_9e8 = 10;
        __l_00._M_len = 10;
        __l_00._M_array = local_9f0;
        local_a50 = (double *)
                    std::vector<double,_std::allocator<double>_>::insert
                              ((vector<double,_std::allocator<double>_> *)local_950,local_9d8,__l_00
                              );
      }
      else {
        local_a60._M_current =
             (double *)
             std::vector<double,_std::allocator<double>_>::end
                       ((vector<double,_std::allocator<double>_> *)local_950);
        __gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>::
        __normal_iterator<double*>
                  ((__normal_iterator<double_const*,std::vector<double,std::allocator<double>>> *)
                   &local_a58,&local_a60);
        local_ab8[6] = 10000.0;
        local_ab8[7] = 20000.0;
        local_ab8[4] = 1000.0;
        local_ab8[5] = 5000.0;
        local_ab8[2] = 100.0;
        local_ab8[3] = 500.0;
        local_ab8[0] = 1.0;
        local_ab8[1] = 50.0;
        local_a70 = local_ab8;
        local_a68 = 8;
        __l._M_len = 8;
        __l._M_array = local_a70;
        std::vector<double,_std::allocator<double>_>::insert
                  ((vector<double,_std::allocator<double>_> *)local_950,local_a58,__l);
      }
    }
    for (i_1 = 0; sVar16 = std::vector<double,_std::allocator<double>_>::size
                                     ((vector<double,_std::allocator<double>_> *)local_950),
        i_1 < sVar16; i_1 = i_1 + 1) {
      for (Nph.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage = (pointer)0x0;
          Nph.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage <
          (pointer)(long)energy_vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage._4_4_;
          Nph.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage =
               (pointer)((long)Nph.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage + 1)) {
        paVar1 = (allocator<double> *)
                 ((long)&Ne.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 7);
        std::allocator<double>::allocator(paVar1);
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)local_ae8,sStack_30,paVar1);
        std::allocator<double>::~allocator
                  ((allocator<double> *)
                   ((long)&Ne.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + 7));
        paVar1 = (allocator<double> *)
                 ((long)&Nex.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 7);
        std::allocator<double>::allocator(paVar1);
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)local_b08,sStack_30,paVar1);
        std::allocator<double>::~allocator
                  ((allocator<double> *)
                   ((long)&Nex.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + 7));
        paVar1 = (allocator<double> *)
                 ((long)&Nion.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 7);
        std::allocator<double>::allocator(paVar1);
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)local_b28,sStack_30,paVar1);
        std::allocator<double>::~allocator
                  ((allocator<double> *)
                   ((long)&Nion.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + 7));
        std::allocator<double>::allocator((allocator<double> *)((long)&j + 7));
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)local_b48,sStack_30,
                   (allocator<double> *)((long)&j + 7));
        std::allocator<double>::~allocator((allocator<double> *)((long)&j + 7));
        for (local_b58 = 0; local_b58 < sStack_30; local_b58 = local_b58 + 1) {
          pvVar15 = std::vector<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_>::
                    operator[]((vector<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_>
                                *)local_a0,
                               (size_type)
                               electric_field.super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
          species = *pvVar15;
          pvVar17 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)&start_val,
                               (size_type)
                               Nph.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage);
          dVar2 = *pvVar17;
          pvVar17 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)local_950,i_1);
          NEST::LArNEST::FullCalculation
                    ((LArNESTResult *)&Nph_mean,
                     (LArNEST *)
                     &result.photon_times.super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,species,dVar2,0.0,*pvVar17,
                     (double)seed,false);
          NEST::LArNESTResult::operator=((LArNESTResult *)local_730,(LArNESTResult *)&Nph_mean);
          NEST::LArNESTResult::~LArNESTResult((LArNESTResult *)&Nph_mean);
          dVar2 = result.yields.ElectricField;
          pvVar17 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)local_ae8,local_b58);
          dVar8 = result.fluctuations.NphFluctuation;
          *pvVar17 = dVar2;
          pvVar17 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)local_b08,local_b58);
          dVar2 = result.fluctuations.NeFluctuation;
          *pvVar17 = dVar8;
          pvVar17 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)local_b28,local_b58);
          dVar8 = result.fluctuations.NexFluctuation;
          *pvVar17 = dVar2;
          pvVar17 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)local_b48,local_b58);
          *pvVar17 = dVar8;
        }
        iVar18 = std::vector<double,_std::allocator<double>_>::begin
                           ((vector<double,_std::allocator<double>_> *)local_ae8);
        iVar19 = std::vector<double,_std::allocator<double>_>::end
                           ((vector<double,_std::allocator<double>_> *)local_ae8);
        dVar2 = std::
                accumulate<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                          ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                            )iVar18._M_current,
                           (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                            )iVar19._M_current,0.0);
        uVar32 = (undefined4)(sStack_30 >> 0x20);
        auVar23._8_4_ = uVar32;
        auVar23._0_8_ = sStack_30;
        auVar23._12_4_ = 0x45300000;
        uVar22 = (undefined4)sStack_30;
        dVar2 = dVar2 / ((auVar23._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,uVar22) - 4503599627370496.0));
        iVar18 = std::vector<double,_std::allocator<double>_>::begin
                           ((vector<double,_std::allocator<double>_> *)local_b08);
        iVar19 = std::vector<double,_std::allocator<double>_>::end
                           ((vector<double,_std::allocator<double>_> *)local_b08);
        dVar8 = std::
                accumulate<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                          ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                            )iVar18._M_current,
                           (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                            )iVar19._M_current,0.0);
        auVar24._8_4_ = uVar32;
        auVar24._0_8_ = sStack_30;
        auVar24._12_4_ = 0x45300000;
        dVar8 = dVar8 / ((auVar24._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,uVar22) - 4503599627370496.0));
        iVar18 = std::vector<double,_std::allocator<double>_>::begin
                           ((vector<double,_std::allocator<double>_> *)local_b28);
        iVar19 = std::vector<double,_std::allocator<double>_>::end
                           ((vector<double,_std::allocator<double>_> *)local_b28);
        dVar9 = std::
                accumulate<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                          ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                            )iVar18._M_current,
                           (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                            )iVar19._M_current,0.0);
        auVar25._8_4_ = uVar32;
        auVar25._0_8_ = sStack_30;
        auVar25._12_4_ = 0x45300000;
        dVar9 = dVar9 / ((auVar25._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,uVar22) - 4503599627370496.0));
        iVar18 = std::vector<double,_std::allocator<double>_>::begin
                           ((vector<double,_std::allocator<double>_> *)local_b48);
        iVar19 = std::vector<double,_std::allocator<double>_>::end
                           ((vector<double,_std::allocator<double>_> *)local_b48);
        dVar10 = std::
                 accumulate<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                           ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                             )iVar18._M_current,
                            (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                             )iVar19._M_current,0.0);
        auVar26._8_4_ = uVar32;
        auVar26._0_8_ = sStack_30;
        auVar26._12_4_ = 0x45300000;
        dVar10 = dVar10 / ((auVar26._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,uVar22) - 4503599627370496.0));
        dVar11 = dVar2 + dVar8;
        Nph_std = 0.0;
        Ne_std = 0.0;
        Nex_std = 0.0;
        Nion_std = 0.0;
        ii = 0;
        for (ii_1 = 0;
            sVar16 = std::vector<double,_std::allocator<double>_>::size
                               ((vector<double,_std::allocator<double>_> *)local_ae8), ii_1 < sVar16
            ; ii_1 = ii_1 + 1) {
          pvVar17 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)local_ae8,ii_1);
          dVar3 = *pvVar17;
          pvVar17 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)local_b08,ii_1);
          dVar4 = *pvVar17;
          pvVar17 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)local_ae8,ii_1);
          dVar5 = *pvVar17;
          pvVar17 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)local_b08,ii_1);
          Nph_std = ((dVar3 + dVar4) - dVar11) * ((dVar5 + *pvVar17) - dVar11) + Nph_std;
        }
        auVar27._8_4_ = uVar32;
        auVar27._0_8_ = sStack_30;
        auVar27._12_4_ = 0x45300000;
        dVar3 = sqrt(Nph_std / ((auVar27._8_8_ - 1.9342813113834067e+25) +
                               ((double)CONCAT44(0x43300000,uVar22) - 4503599627370496.0)));
        for (ii_2 = 0;
            sVar16 = std::vector<double,_std::allocator<double>_>::size
                               ((vector<double,_std::allocator<double>_> *)local_ae8), ii_2 < sVar16
            ; ii_2 = ii_2 + 1) {
          pvVar17 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)local_ae8,ii_2);
          dVar4 = *pvVar17;
          pvVar17 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)local_ae8,ii_2);
          Ne_std = (dVar4 - dVar2) * (*pvVar17 - dVar2) + Ne_std;
        }
        auVar28._8_4_ = uVar32;
        auVar28._0_8_ = sStack_30;
        auVar28._12_4_ = 0x45300000;
        dVar4 = sqrt(Ne_std / ((auVar28._8_8_ - 1.9342813113834067e+25) +
                              ((double)CONCAT44(0x43300000,uVar22) - 4503599627370496.0)));
        for (ii_3 = 0;
            sVar16 = std::vector<double,_std::allocator<double>_>::size
                               ((vector<double,_std::allocator<double>_> *)local_b08), ii_3 < sVar16
            ; ii_3 = ii_3 + 1) {
          pvVar17 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)local_b08,ii_3);
          dVar5 = *pvVar17;
          pvVar17 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)local_b08,ii_3);
          Nex_std = (dVar5 - dVar8) * (*pvVar17 - dVar8) + Nex_std;
        }
        auVar29._8_4_ = uVar32;
        auVar29._0_8_ = sStack_30;
        auVar29._12_4_ = 0x45300000;
        dVar5 = sqrt(Nex_std / ((auVar29._8_8_ - 1.9342813113834067e+25) +
                               ((double)CONCAT44(0x43300000,uVar22) - 4503599627370496.0)));
        for (ii_4 = 0;
            sVar16 = std::vector<double,_std::allocator<double>_>::size
                               ((vector<double,_std::allocator<double>_> *)local_b28), ii_4 < sVar16
            ; ii_4 = ii_4 + 1) {
          pvVar17 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)local_b28,ii_4);
          dVar6 = *pvVar17;
          pvVar17 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)local_b28,ii_4);
          Nion_std = (dVar6 - dVar9) * (*pvVar17 - dVar9) + Nion_std;
        }
        auVar30._8_4_ = uVar32;
        auVar30._0_8_ = sStack_30;
        auVar30._12_4_ = 0x45300000;
        dVar6 = sqrt(Nion_std /
                     ((auVar30._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,uVar22) - 4503599627370496.0)));
        for (local_c90 = 0;
            sVar16 = std::vector<double,_std::allocator<double>_>::size
                               ((vector<double,_std::allocator<double>_> *)local_b48),
            local_c90 < sVar16; local_c90 = local_c90 + 1) {
          pvVar17 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)local_b48,local_c90);
          dVar7 = *pvVar17;
          pvVar17 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)local_b48,local_c90);
          ii = (size_t)((dVar7 - dVar10) * (*pvVar17 - dVar10) + (double)ii);
        }
        auVar31._8_4_ = uVar32;
        auVar31._0_8_ = sStack_30;
        auVar31._12_4_ = 0x45300000;
        dVar7 = sqrt((double)ii /
                     ((auVar31._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,uVar22) - 4503599627370496.0)));
        pvVar20 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_d8,
                               (size_type)
                               electric_field.super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
        poVar21 = std::operator<<((ostream *)&k,(string *)pvVar20);
        std::operator<<(poVar21,",");
        pvVar17 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)&start_val,
                             (size_type)
                             Nph.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage);
        poVar21 = (ostream *)std::ostream::operator<<((ostream *)&k,*pvVar17);
        std::operator<<(poVar21,",");
        pvVar17 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)local_950,i_1);
        poVar21 = (ostream *)std::ostream::operator<<((ostream *)&k,*pvVar17);
        std::operator<<(poVar21,",");
        pvVar17 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)&start_val,
                             (size_type)
                             Nph.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage);
        poVar21 = (ostream *)std::ostream::operator<<((ostream *)&k,dVar11 / *pvVar17);
        std::operator<<(poVar21,",");
        pvVar17 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)&start_val,
                             (size_type)
                             Nph.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage);
        poVar21 = (ostream *)std::ostream::operator<<((ostream *)&k,dVar8 / *pvVar17);
        std::operator<<(poVar21,",");
        pvVar17 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)&start_val,
                             (size_type)
                             Nph.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage);
        poVar21 = (ostream *)std::ostream::operator<<((ostream *)&k,dVar2 / *pvVar17);
        std::operator<<(poVar21,",");
        poVar21 = (ostream *)std::ostream::operator<<((ostream *)&k,dVar2);
        std::operator<<(poVar21,",");
        poVar21 = (ostream *)std::ostream::operator<<((ostream *)&k,dVar8);
        std::operator<<(poVar21,",");
        poVar21 = (ostream *)std::ostream::operator<<((ostream *)&k,dVar9);
        std::operator<<(poVar21,",");
        poVar21 = (ostream *)std::ostream::operator<<((ostream *)&k,dVar10);
        std::operator<<(poVar21,",");
        pvVar17 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)&start_val,
                             (size_type)
                             Nph.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage);
        poVar21 = (ostream *)std::ostream::operator<<((ostream *)&k,dVar3 / *pvVar17);
        std::operator<<(poVar21,",");
        pvVar17 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)&start_val,
                             (size_type)
                             Nph.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage);
        poVar21 = (ostream *)std::ostream::operator<<((ostream *)&k,dVar5 / *pvVar17);
        std::operator<<(poVar21,",");
        pvVar17 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)&start_val,
                             (size_type)
                             Nph.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage);
        poVar21 = (ostream *)std::ostream::operator<<((ostream *)&k,dVar4 / *pvVar17);
        std::operator<<(poVar21,",");
        poVar21 = (ostream *)std::ostream::operator<<((ostream *)&k,dVar4);
        std::operator<<(poVar21,",");
        poVar21 = (ostream *)std::ostream::operator<<((ostream *)&k,dVar5);
        std::operator<<(poVar21,",");
        poVar21 = (ostream *)std::ostream::operator<<((ostream *)&k,dVar6);
        std::operator<<(poVar21,",");
        poVar21 = (ostream *)std::ostream::operator<<((ostream *)&k,dVar7);
        std::operator<<(poVar21,"\n");
        std::vector<double,_std::allocator<double>_>::~vector
                  ((vector<double,_std::allocator<double>_> *)local_b48);
        std::vector<double,_std::allocator<double>_>::~vector
                  ((vector<double,_std::allocator<double>_> *)local_b28);
        std::vector<double,_std::allocator<double>_>::~vector
                  ((vector<double,_std::allocator<double>_> *)local_b08);
        std::vector<double,_std::allocator<double>_>::~vector
                  ((vector<double,_std::allocator<double>_> *)local_ae8);
      }
    }
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_950);
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&k);
  NEST::LArNESTResult::~LArNESTResult((LArNESTResult *)local_730);
  NEST::LArNEST::~LArNEST
            ((LArNEST *)
             &result.photon_times.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_d8);
  std::vector<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_>::~vector
            ((vector<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_> *)local_a0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)&start_val);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
  // this sample program takes can take two arguments,
  // (optional) 1) density - the density of the LAr to use
  // (optional) 2) seed - a seed for the random number generator

  double density = 1.393;
  uint64_t seed = 0;
  uint64_t num_events = 100;
  if (argc > 1) {
    density = atof(argv[1]);
  }
  if (argc > 2) {
    seed = atoi(argv[2]);
  }
  if (argc > 3) {
    num_events = atoi(argv[3]);
  }

  // set up energy steps
  int num_energy_steps = 50000;
  std::vector<double> energy_vals;
  double start_val = .1;
  double end_val = 1000;
  double step_size = (end_val - start_val) / num_energy_steps;

  for (size_t i = 0; i < num_energy_steps; i++) {
    energy_vals.emplace_back(start_val + step_size * i);
  }
  std::vector<NEST::LArInteraction> particle_types = {
      NEST::LArInteraction::NR, NEST::LArInteraction::ER,
      NEST::LArInteraction::Alpha};
  std::vector<std::string> particle_type = {"NR", "ER", "Alpha"};

  LArDetector* detector = new LArDetector();
  // Construct NEST class using detector object
  NEST::LArNEST larnest(detector);
  // Set random seed of RandomGen class
  RandomGen::rndm()->SetSeed(seed);

  // Construct NEST objects for storing calculation results
  NEST::LArNESTResult result;
  std::ofstream output_file;

  output_file.open("fluctuation_benchmarks.csv");
  output_file << "type,energy,efield,TotalYield,QuantaYield,LightYield,Nph,Ne,"
                 "Nex,Nion,TotalYield_std,QuantaYield_std,LightYield_std,Nph_"
                 "std,Ne_std,Nex_std,Nion_std\n";

  // iterate over electric field values
  for (size_t k = 0; k < particle_types.size(); k++) {
    std::vector<double> electric_field;
    if (particle_types[k] == NEST::LArInteraction::NR) {
      electric_field.insert(electric_field.end(), {1, 50, 100, 200, 250, 500,
                                                   1000, 1500, 1750, 2000});
    } else if (particle_types[k] == NEST::LArInteraction::ER) {
      electric_field.insert(electric_field.end(), {1, 100, 200, 600, 1000, 1500,
                                                   2500, 6000, 9000, 9500});
    } else {
      electric_field.insert(electric_field.end(),
                            {1, 50, 100, 500, 1000, 5000, 10000, 20000});
    }
    // iterate over number of events
    for (size_t v = 0; v < electric_field.size(); v++) {
      for (size_t i = 0; i < num_energy_steps; i++) {
        std::vector<double> Nph(num_events);
        std::vector<double> Ne(num_events);
        std::vector<double> Nex(num_events);
        std::vector<double> Nion(num_events);
        // collect statistics for each event
        for (size_t j = 0; j < num_events; j++) {
          result = larnest.FullCalculation(particle_types[k], energy_vals[i], 0,
                                           electric_field[v], density, false);
          Nph[j] = double(result.fluctuations.NphFluctuation);
          Ne[j] = double(result.fluctuations.NeFluctuation);
          Nex[j] = double(result.fluctuations.NexFluctuation);
          Nion[j] = double(result.fluctuations.NionFluctuation);
        }
        double Nph_mean =
            std::accumulate(Nph.begin(), Nph.end(), 0.0) / double(num_events);
        double Ne_mean =
            std::accumulate(Ne.begin(), Ne.end(), 0.0) / double(num_events);
        double Nex_mean =
            std::accumulate(Nex.begin(), Nex.end(), 0.0) / double(num_events);
        double Nion_mean =
            std::accumulate(Nion.begin(), Nion.end(), 0.0) / double(num_events);

        double Nq_mean = Nph_mean + Ne_mean;
        double Nq_std = 0.0;
        double Nph_std = 0.0;
        double Ne_std = 0.0;
        double Nex_std = 0.0;
        double Nion_std = 0.0;

        for (size_t ii = 0; ii < Nph.size(); ii++) {
          Nq_std += (Nph[ii] + Ne[ii] - Nq_mean) * (Nph[ii] + Ne[ii] - Nq_mean);
        }
        Nq_std = std::sqrt(Nq_std / double(num_events));

        for (size_t ii = 0; ii < Nph.size(); ii++) {
          Nph_std += (Nph[ii] - Nph_mean) * (Nph[ii] - Nph_mean);
        }
        Nph_std = std::sqrt(Nph_std / double(num_events));

        for (size_t ii = 0; ii < Ne.size(); ii++) {
          Ne_std += (Ne[ii] - Ne_mean) * (Ne[ii] - Ne_mean);
        }
        Ne_std = std::sqrt(Ne_std / double(num_events));

        for (size_t ii = 0; ii < Nex.size(); ii++) {
          Nex_std += (Nex[ii] - Nex_mean) * (Nex[ii] - Nex_mean);
        }
        Nex_std = std::sqrt(Nex_std / double(num_events));

        for (size_t ii = 0; ii < Nion.size(); ii++) {
          Nion_std += (Nion[ii] - Nion_mean) * (Nion[ii] - Nion_mean);
        }
        Nion_std = std::sqrt(Nion_std / double(num_events));

        output_file << particle_type[k] << ",";
        output_file << energy_vals[i] << ",";
        output_file << electric_field[v] << ",";
        output_file << (Nq_mean / energy_vals[i]) << ",";
        output_file << (Ne_mean / energy_vals[i]) << ",";
        output_file << (Nph_mean / energy_vals[i]) << ",";
        output_file << Nph_mean << ",";
        output_file << Ne_mean << ",";
        output_file << Nex_mean << ",";
        output_file << Nion_mean << ",";
        output_file << (Nq_std / energy_vals[i]) << ",";
        output_file << (Ne_std / energy_vals[i]) << ",";
        output_file << (Nph_std / energy_vals[i]) << ",";
        output_file << Nph_std << ",";
        output_file << Ne_std << ",";
        output_file << Nex_std << ",";
        output_file << Nion_std << "\n";
      }
    }
  }
  output_file.close();
  return 0;
}